

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O0

void __thiscall UtxoUtil_ConvertToUtxo_list_Test::TestBody(UtxoUtil_ConvertToUtxo_list_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  uchar *puVar8;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> results;
  UtxoData utxo2;
  UtxoData utxo1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  bool *in_stack_fffffffffffff2f8;
  undefined6 in_stack_fffffffffffff300;
  undefined1 in_stack_fffffffffffff306;
  undefined1 in_stack_fffffffffffff307;
  value_type *in_stack_fffffffffffff308;
  uint8_t *lhs;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff310;
  undefined6 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31e;
  undefined1 in_stack_fffffffffffff31f;
  AssertHelper in_stack_fffffffffffff348;
  Message local_cb0;
  AssertionResult local_ca8;
  string local_c98 [8];
  UtxoData *in_stack_fffffffffffff370;
  AssertHelper local_c78;
  Message local_c70;
  ByteData local_c68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c50;
  undefined1 local_c31;
  AssertionResult local_c30;
  AssertHelper local_c20;
  Message local_c18;
  AssertionResult local_c10;
  string local_c00;
  AssertHelper local_be0;
  Message local_bd8;
  ByteData local_bd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_bb8;
  undefined1 local_b99;
  AssertionResult local_b98;
  AssertHelper local_b88;
  Message local_b80;
  undefined4 local_b74;
  size_type local_b70;
  AssertionResult local_b68;
  AssertHelper local_b58;
  Message local_b50 [5];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_b28;
  allocator local_b09;
  string local_b08;
  Txid local_ae8 [2];
  Txid local_aa0;
  undefined4 local_a80;
  undefined4 local_858;
  allocator local_599;
  string local_598;
  Txid local_578 [2];
  Txid local_520;
  undefined4 local_500;
  undefined4 local_2d8;
  
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x29229c);
  cfd::UtxoData::UtxoData(in_stack_fffffffffffff370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_598,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,&local_599);
  cfd::core::Txid::Txid(local_578,&local_598);
  cfd::core::Txid::operator=(&local_520,local_578);
  cfd::core::Txid::~Txid((Txid *)0x292313);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  local_500 = 1;
  local_2d8 = 4;
  cfd::UtxoData::UtxoData(in_stack_fffffffffffff370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b08,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,&local_b09);
  cfd::core::Txid::Txid(local_ae8,&local_b08);
  cfd::core::Txid::operator=(&local_aa0,local_ae8);
  cfd::core::Txid::~Txid((Txid *)0x2923ba);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  local_a80 = 2;
  local_858 = 4;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff310,
             in_stack_fffffffffffff308);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff310,
             in_stack_fffffffffffff308);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x292425);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::UtxoUtil::ConvertToUtxo
                ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                 in_stack_fffffffffffff348.data_);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffff310,
                 (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff308);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff310);
    }
  }
  else {
    testing::Message::Message(local_b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_b58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x20,
               "Expected: (results = UtxoUtil::ConvertToUtxo(utxos)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b58,local_b50);
    testing::internal::AssertHelper::~AssertHelper(&local_b58);
    testing::Message::~Message((Message *)0x292674);
  }
  local_b70 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_b28);
  local_b74 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)CONCAT17(in_stack_fffffffffffff31f,
                              CONCAT16(in_stack_fffffffffffff31e,in_stack_fffffffffffff318)),
             (char *)in_stack_fffffffffffff310,&in_stack_fffffffffffff308->block_height,
             (int *)CONCAT17(in_stack_fffffffffffff307,
                             CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b68);
  if (!bVar1) {
    testing::Message::Message(&local_b80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x292763);
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x21,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b88,&local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    testing::Message::~Message((Message *)0x2927c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x292818);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_b28);
  if (sVar6 == 2) {
    pvVar7 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_b28,0);
    cfd::core::Txid::GetData(&local_bd0,&local_520);
    cfd::core::ByteData::GetBytes(&local_bb8,&local_bd0);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x292884);
    iVar4 = memcmp(pvVar7->txid,puVar8,0x20);
    local_b99 = iVar4 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)
               CONCAT17(in_stack_fffffffffffff307,
                        CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)),
               in_stack_fffffffffffff2f8,(type *)0x2928b9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff310);
    cfd::core::ByteData::~ByteData((ByteData *)0x2928d5);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_b98);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_bd8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c00,(internal *)&local_b98,
                 (AssertionResult *)
                 "(memcmp(results[0].txid, utxo1.txid.GetData().GetBytes().data(), sizeof(results[0].txid)) == 0)"
                 ,"false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_be0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
                 ,0x24,pcVar5);
      testing::internal::AssertHelper::operator=(&local_be0,&local_bd8);
      testing::internal::AssertHelper::~AssertHelper(&local_be0);
      std::__cxx11::string::~string((string *)&local_c00);
      testing::Message::~Message((Message *)0x292a14);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x292a8c);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_b28,0);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff31e,in_stack_fffffffffffff318))
               ,(char *)in_stack_fffffffffffff310,(uint *)in_stack_fffffffffffff308,
               (uint *)CONCAT17(in_stack_fffffffffffff307,
                                CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
    uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_c10);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_c18);
      in_stack_fffffffffffff310 =
           (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x292b32);
      testing::internal::AssertHelper::AssertHelper
                (&local_c20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
                 ,0x25,(char *)in_stack_fffffffffffff310);
      testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
      testing::internal::AssertHelper::~AssertHelper(&local_c20);
      testing::Message::~Message((Message *)0x292b8f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x292be7);
    pvVar7 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_b28,1);
    lhs = pvVar7->txid;
    cfd::core::Txid::GetData(&local_c68,&local_aa0);
    cfd::core::ByteData::GetBytes(&local_c50,&local_c68);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x292c3d);
    iVar4 = memcmp(lhs,puVar8,0x20);
    local_c31 = iVar4 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)
               CONCAT17(in_stack_fffffffffffff307,
                        CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)),
               in_stack_fffffffffffff2f8,(type *)0x292c72);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff310);
    cfd::core::ByteData::~ByteData((ByteData *)0x292c8e);
    in_stack_fffffffffffff307 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
    if (!(bool)in_stack_fffffffffffff307) {
      testing::Message::Message(&local_c70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c98,(internal *)&local_c30,
                 (AssertionResult *)
                 "(memcmp(results[1].txid, utxo2.txid.GetData().GetBytes().data(), sizeof(results[1].txid)) == 0)"
                 ,"false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
                 ,0x27,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c78,&local_c70);
      testing::internal::AssertHelper::~AssertHelper(&local_c78);
      std::__cxx11::string::~string(local_c98);
      testing::Message::~Message((Message *)0x292dc4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x292e39);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_b28,1);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((char *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff318)),
               (char *)in_stack_fffffffffffff310,(uint *)lhs,
               (uint *)CONCAT17(in_stack_fffffffffffff307,
                                CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
    in_stack_fffffffffffff306 = testing::AssertionResult::operator_cast_to_bool(&local_ca8);
    if (!(bool)in_stack_fffffffffffff306) {
      testing::Message::Message(&local_cb0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x292ed4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffff348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_utxoutil.cpp"
                 ,0x28,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffff348,&local_cb0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff348);
      testing::Message::~Message((Message *)0x292f20);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x292f6c);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff310);
  cfd::UtxoData::~UtxoData
            ((UtxoData *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  cfd::UtxoData::~UtxoData
            ((UtxoData *)
             CONCAT17(in_stack_fffffffffffff307,
                      CONCAT16(in_stack_fffffffffffff306,in_stack_fffffffffffff300)));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_fffffffffffff310);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo_list)
{
  std::vector<UtxoData> utxos;
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo2;
  utxo2.txid = Txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
  utxo2.vout = 2;
  utxo2.address_type = AddressType::kP2wpkhAddress;
  utxos.push_back(utxo1);
  utxos.push_back(utxo2);

  std::vector<Utxo> results;
  EXPECT_NO_THROW((results = UtxoUtil::ConvertToUtxo(utxos)));
  EXPECT_EQ(results.size(), 2);
  if (results.size() == 2) {
    EXPECT_TRUE((memcmp(results[0].txid,
        utxo1.txid.GetData().GetBytes().data(), sizeof(results[0].txid)) == 0));
    EXPECT_EQ(results[0].vout, utxo1.vout);
    EXPECT_TRUE((memcmp(results[1].txid,
        utxo2.txid.GetData().GetBytes().data(), sizeof(results[1].txid)) == 0));
    EXPECT_EQ(results[1].vout, utxo2.vout);
  }
}